

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.hpp
# Opt level: O3

IStreamer * __thiscall LiteScript::IStreamer::operator>>(IStreamer *this,int *v)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  iVar4 = std::istream::get();
  *v = iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
  return this;
}

Assistant:

IStreamer& operator>>(T& v) {
            v = Read<T>(this->stream);
            return *this;
        }